

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

CompileData * __thiscall
anon_unknown.dwarf_1144a71::Target::BuildCompileData
          (CompileData *__return_storage_ptr__,Target *this,cmSourceFile *sf)

{
  JBTIndex *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __node_base_ptr *pp_Var2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmGeneratorTarget *pcVar3;
  undefined8 this_02;
  bool bVar4;
  string *psVar5;
  ulong uVar6;
  cmLocalGenerator *localGenerator;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar7;
  pointer ppVar8;
  reference dir;
  reference pBVar9;
  size_type sVar10;
  size_type sVar11;
  reference __args;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_&&>::value,_pair<iterator,_bool>_>
  _Var12;
  byte local_9e2;
  JBTIndex local_93c;
  reference local_938;
  string *d;
  iterator __end1_4;
  iterator __begin1_4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_4;
  reference local_8f0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *def_1;
  iterator __end1_3;
  iterator __begin1_3;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_3;
  cmValue local_8b0;
  cmValue config_defs;
  undefined1 local_888 [8];
  string defPropName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configFileDefines;
  cmListFileBacktrace local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  undefined1 local_7f8 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> def;
  string *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp_3;
  undefined1 local_758 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tmpDef;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_2;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileDefines;
  undefined1 local_6d8 [8];
  string COMPILE_DEFINITIONS;
  cmListFileBacktrace local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  undefined1 local_660 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> include;
  bool isSystemInclude;
  string *i;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp_2;
  undefined1 local_5d0 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tmpInclude;
  const_iterator __end2;
  const_iterator __begin2;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  undefined1 local_580 [8];
  string INCLUDE_DIRECTORIES;
  cmListFileBacktrace local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  undefined1 local_508 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> opt_1;
  string tmp_1;
  cmListFileBacktrace local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tmpOpt_1;
  string local_418;
  string local_3f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_3d0;
  iterator pchIt;
  string pchOptions;
  string local_3a0;
  cmValue local_380;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_378;
  undefined1 local_370;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  undefined1 local_328 [8];
  string pchSource;
  string *arch;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  cmListFileBacktrace local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> opt;
  string tmp;
  undefined1 local_1d0 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tmpOpt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  undefined1 local_180 [8];
  string COMPILE_OPTIONS;
  string local_158;
  undefined1 local_138 [8];
  string flags;
  cmValue cflags;
  undefined1 local_108 [8];
  string COMPILE_FLAGS;
  string local_c8;
  undefined1 local_a8 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  cmLocalGenerator *lg;
  cmSourceFile *sf_local;
  Target *this_local;
  CompileData *fd;
  
  CompileData::CompileData(__return_storage_ptr__);
  psVar5 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(sf);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar5);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    localGenerator = cmGeneratorTarget::GetLocalGenerator(this->GT);
    genexInterpreter.Language.field_2._8_8_ = localGenerator;
    std::__cxx11::string::string((string *)&local_c8,(string *)this->Config);
    pcVar3 = this->GT;
    std::__cxx11::string::string
              ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
    cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)local_a8,localGenerator,&local_c8,pcVar3,
               (string *)((long)&COMPILE_FLAGS.field_2 + 8));
    std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags.Value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&cflags.Value + 7));
    flags.field_2._8_8_ = cmSourceFile::GetProperty(sf,(string *)local_108);
    bVar4 = cmValue::operator_cast_to_bool((cmValue *)((long)&flags.field_2 + 8));
    if (bVar4) {
      psVar5 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&flags.field_2 + 8));
      std::__cxx11::string::string((string *)&local_158,(string *)psVar5);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,&local_158,
                          (string *)local_108);
      std::__cxx11::string::string((string *)local_138,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_158);
      COMPILE_OPTIONS.field_2._12_4_ = 0;
      this_00 = (JBTIndex *)((long)&COMPILE_OPTIONS.field_2 + 0xc);
      JBTIndex::JBTIndex(this_00);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&__return_storage_ptr__->Flags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 this_00);
      std::__cxx11::string::~string((string *)local_138);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_180,"COMPILE_OPTIONS",(allocator<char> *)((long)&__range1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    pvVar7 = cmSourceFile::GetCompileOptions_abi_cxx11_(sf);
    __end1 = std::
             vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pvVar7);
    tmpOpt.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(pvVar7);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&tmpOpt.Backtrace.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar4) {
      pBVar9 = __gnu_cxx::
               __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1d0,pBVar9);
      std::__cxx11::string::string((string *)(tmp.field_2._M_local_buf + 8),(string *)local_1d0);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,
                          (string *)((long)&tmp.field_2 + 8),(string *)local_180);
      std::__cxx11::string::operator=((string *)local_1d0,(string *)psVar5);
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
      p_Var1 = &opt.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      std::__cxx11::string::string((string *)p_Var1);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)genexInterpreter.Language.field_2._8_8_,(string *)p_Var1,
                 (string *)local_1d0,(char *)0x0);
      std::__cxx11::string::string
                ((string *)&local_260,
                 (string *)
                 &opt.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      cmListFileBacktrace::cmListFileBacktrace
                (&local_270,(cmListFileBacktrace *)((long)&tmpOpt.Value.field_2 + 8));
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240,&local_260,&local_270);
      cmListFileBacktrace::~cmListFileBacktrace(&local_270);
      std::__cxx11::string::~string((string *)&local_260);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&architectures.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&__return_storage_ptr__->Flags,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&architectures.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBT
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&architectures.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240);
      std::__cxx11::string::~string
                ((string *)
                 &opt.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1d0);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1);
    }
    pp_Var2 = &pchSources._M_h._M_single_bucket;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pp_Var2);
    cmGeneratorTarget::GetAppleArchs
              (this->GT,this->Config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pp_Var2);
    bVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pchSources._M_h._M_single_bucket);
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pchSources._M_h._M_single_bucket);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range1_1);
    pp_Var2 = &pchSources._M_h._M_single_bucket;
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pp_Var2);
    arch = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pp_Var2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&arch), bVar4) {
      pchSource.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_1);
      cmGeneratorTarget::GetPchSource
                ((string *)local_328,this->GT,this->Config,&__return_storage_ptr__->Language,
                 (string *)pchSource.field_2._8_8_);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pchSource.field_2._8_8_);
        _Var12 = std::
                 unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&__range1_1,&local_368);
        local_378._M_cur =
             (__node_type *)
             _Var12.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur;
        local_370 = _Var12.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_368);
      }
      std::__cxx11::string::~string((string *)local_328);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    bVar4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range1_1);
    pchOptions.field_2._M_local_buf[0xe] = '\0';
    pchOptions.field_2._M_local_buf[0xd] = '\0';
    local_9e2 = 0;
    if (!bVar4) {
      std::allocator<char>::allocator();
      pchOptions.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"SKIP_PRECOMPILE_HEADERS",
                 (allocator<char> *)(pchOptions.field_2._M_local_buf + 0xf));
      pchOptions.field_2._M_local_buf[0xd] = '\x01';
      local_380 = cmSourceFile::GetProperty(sf,&local_3a0);
      bVar4 = cmValue::operator_cast_to_bool(&local_380);
      local_9e2 = bVar4 ^ 0xff;
    }
    if ((pchOptions.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    if ((pchOptions.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(pchOptions.field_2._M_local_buf + 0xf));
    }
    if ((local_9e2 & 1) != 0) {
      std::__cxx11::string::string((string *)&pchIt);
      psVar5 = cmSourceFile::ResolveFullPath(sf,(string *)0x0,(string *)0x0);
      local_3d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range1_1,psVar5);
      local_3d8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range1_1);
      bVar4 = std::__detail::operator!=(&local_3d0,&local_3d8);
      if (bVar4) {
        pcVar3 = this->GT;
        psVar5 = this->Config;
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                               *)&local_3d0);
        cmGeneratorTarget::GetPchCreateCompileOptions
                  (&local_3f8,pcVar3,psVar5,&__return_storage_ptr__->Language,&ppVar8->second);
        std::__cxx11::string::operator=((string *)&pchIt,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
      }
      else {
        pcVar3 = this->GT;
        psVar5 = this->Config;
        p_Var1 = &tmpOpt_1.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        std::__cxx11::string::string((string *)p_Var1);
        cmGeneratorTarget::GetPchUseCompileOptions
                  (&local_418,pcVar3,psVar5,&__return_storage_ptr__->Language,(string *)p_Var1);
        std::__cxx11::string::operator=((string *)&pchIt,(string *)&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string
                  ((string *)
                   &tmpOpt_1.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::__cxx11::string::string((string *)&local_488,(string *)&pchIt);
      local_498.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_498.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_498);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_468,&local_488,&local_498);
      cmListFileBacktrace::~cmListFileBacktrace(&local_498);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::string((string *)(tmp_1.field_2._M_local_buf + 8),(string *)local_468);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,
                          (string *)((long)&tmp_1.field_2 + 8),(string *)local_180);
      std::__cxx11::string::operator=((string *)local_468,(string *)psVar5);
      std::__cxx11::string::~string((string *)(tmp_1.field_2._M_local_buf + 8));
      p_Var1 = &opt_1.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      std::__cxx11::string::string((string *)p_Var1);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)genexInterpreter.Language.field_2._8_8_,(string *)p_Var1,
                 (string *)local_468,(char *)0x0);
      std::__cxx11::string::string
                ((string *)&local_528,
                 (string *)
                 &opt_1.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      cmListFileBacktrace::cmListFileBacktrace
                (&local_538,(cmListFileBacktrace *)((long)&tmpOpt_1.Value.field_2 + 8));
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_508,&local_528,&local_538);
      cmListFileBacktrace::~cmListFileBacktrace(&local_538);
      std::__cxx11::string::~string((string *)&local_528);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&INCLUDE_DIRECTORIES.field_2 + 8),this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_508);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&__return_storage_ptr__->Flags,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
      JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBT
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_508);
      std::__cxx11::string::~string
                ((string *)
                 &opt_1.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_468);
      std::__cxx11::string::~string((string *)&pchIt);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_580,"INCLUDE_DIRECTORIES",(allocator<char> *)((long)&__range2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    pvVar7 = cmSourceFile::GetIncludeDirectories_abi_cxx11_(sf);
    __end2 = std::
             vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pvVar7);
    tmpInclude.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(pvVar7);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&tmpInclude.Backtrace.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount), bVar4) {
      pBVar9 = __gnu_cxx::
               __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end2);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_5d0,pBVar9);
      std::__cxx11::string::string
                ((string *)
                 &tmp_2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_5d0);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,
                          (string *)
                          &tmp_2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_580);
      std::__cxx11::string::operator=((string *)local_5d0,(string *)psVar5);
      std::__cxx11::string::~string
                ((string *)
                 &tmp_2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
      cmLocalGenerator::AppendIncludeDirectories
                ((cmLocalGenerator *)genexInterpreter.Language.field_2._8_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3,(string *)local_5d0,sf);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar4) {
        dir = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
        include.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._7_1_ =
             cmGeneratorTarget::IsSystemIncludeDirectory
                       (this->GT,dir,this->Config,&__return_storage_ptr__->Language);
        std::__cxx11::string::string((string *)&local_680,(string *)dir);
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_690,(cmListFileBacktrace *)((long)&tmpInclude.Value.field_2 + 8));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_660,&local_680,&local_690);
        cmListFileBacktrace::~cmListFileBacktrace(&local_690);
        std::__cxx11::string::~string((string *)&local_680);
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&COMPILE_DEFINITIONS.field_2 + 8),this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_660);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&__return_storage_ptr__->Includes,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&COMPILE_DEFINITIONS.field_2 + 8),
                   (bool *)((long)&include.Backtrace.
                                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                   TopEntry.
                                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7));
        JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBT
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&COMPILE_DEFINITIONS.field_2 + 8));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_660);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_5d0);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)local_580);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6d8,"COMPILE_DEFINITIONS",
               (allocator<char> *)
               ((long)&fileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::
    set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&__range1_2);
    pvVar7 = cmSourceFile::GetCompileDefinitions_abi_cxx11_(sf);
    __end1_2 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar7);
    tmpDef.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(pvVar7);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&tmpDef.Backtrace.
                                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar4) {
      pBVar9 = __gnu_cxx::
               __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1_2);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_758,pBVar9);
      std::__cxx11::string::string
                ((string *)&tmp_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)local_758);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,
                          (string *)&tmp_3._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (string *)local_6d8);
      std::__cxx11::string::operator=((string *)local_758,(string *)psVar5);
      std::__cxx11::string::~string
                ((string *)&tmp_3._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2_1);
      cmLocalGenerator::AppendDefines
                ((cmLocalGenerator *)genexInterpreter.Language.field_2._8_8_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2_1,(string *)local_758);
      __end2_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2_1);
      i_1 = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2_1);
      while (bVar4 = std::operator!=(&__end2_1,(_Self *)&i_1), bVar4) {
        def.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2_1);
        std::__cxx11::string::string
                  ((string *)&local_818,
                   (string *)
                   def.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                   .
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_828,(cmListFileBacktrace *)((long)&tmpDef.Value.field_2 + 8));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7f8,&local_818,&local_828);
        cmListFileBacktrace::~cmListFileBacktrace(&local_828);
        std::__cxx11::string::~string((string *)&local_818);
        std::
        set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range1_2,(value_type *)local_7f8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7f8);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2_1);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_758);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_2);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&defPropName.field_2 + 8));
    cmsys::SystemTools::UpperCase((string *)&config_defs,this->Config);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_888,
                   "COMPILE_DEFINITIONS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config_defs
                  );
    std::__cxx11::string::~string((string *)&config_defs);
    local_8b0 = cmSourceFile::GetProperty(sf,(string *)local_888);
    bVar4 = cmValue::operator_cast_to_bool(&local_8b0);
    this_02 = genexInterpreter.Language.field_2._8_8_;
    if (bVar4) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_8b0);
      std::__cxx11::string::string((string *)&__range1_3,(string *)psVar5);
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_a8,(string *)&__range1_3,
                          (string *)local_6d8);
      cmLocalGenerator::AppendDefines
                ((cmLocalGenerator *)this_02,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&defPropName.field_2 + 8),psVar5);
      std::__cxx11::string::~string((string *)&__range1_3);
    }
    sVar10 = std::
             set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range1_2);
    sVar11 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&defPropName.field_2 + 8));
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve(&__return_storage_ptr__->Defines,sVar10 + sVar11);
    __end1_3 = std::
               set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range1_2);
    def_1 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
            std::
            set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range1_2);
    while (bVar4 = std::operator!=(&__end1_3,(_Self *)&def_1), bVar4) {
      local_8f0 = std::
                  _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end1_3);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__range1_4,this,local_8f0);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&__return_storage_ptr__->Defines,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__range1_4);
      JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBT
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__range1_4);
      std::
      _Rb_tree_const_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_3);
    }
    this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&defPropName.field_2 + 8);
    __end1_4 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
    d = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while (bVar4 = std::operator!=(&__end1_4,(_Self *)&d), bVar4) {
      __args = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1_4);
      local_93c.Index = 0;
      local_938 = __args;
      JBTIndex::JBTIndex(&local_93c);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&__return_storage_ptr__->Defines,__args,&local_93c);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_4);
    }
    std::__cxx11::string::~string((string *)local_888);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&defPropName.field_2 + 8));
    std::
    set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~set((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range1_2);
    std::__cxx11::string::~string((string *)local_6d8);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pchSources._M_h._M_single_bucket);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_108);
    cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

CompileData Target::BuildCompileData(cmSourceFile* sf)
{
  CompileData fd;

  fd.Language = sf->GetOrDetermineLanguage();
  if (fd.Language.empty()) {
    return fd;
  }

  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmGeneratorExpressionInterpreter genexInterpreter(lg, this->Config, this->GT,
                                                    fd.Language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = sf->GetProperty(COMPILE_FLAGS)) {
    std::string flags = genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS);
    fd.Flags.emplace_back(std::move(flags), JBTIndex());
  }
  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  for (BT<std::string> tmpOpt : sf->GetCompileOptions()) {
    tmpOpt.Value = genexInterpreter.Evaluate(tmpOpt.Value, COMPILE_OPTIONS);
    // After generator evaluation we need to use the AppendCompileOptions
    // method so we handle situations where backtrace entries have lists
    // and properly escape flags.
    std::string tmp;
    lg->AppendCompileOptions(tmp, tmpOpt.Value);
    BT<std::string> opt(tmp, tmpOpt.Backtrace);
    fd.Flags.emplace_back(this->ToJBT(opt));
  }

  // Add precompile headers compile options.
  std::vector<std::string> architectures;
  this->GT->GetAppleArchs(this->Config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::unordered_map<std::string, std::string> pchSources;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GT->GetPchSource(this->Config, fd.Language, arch);
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  if (!pchSources.empty() && !sf->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(sf->ResolveFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GT->GetPchCreateCompileOptions(
        this->Config, fd.Language, pchIt->second);
    } else {
      pchOptions =
        this->GT->GetPchUseCompileOptions(this->Config, fd.Language);
    }

    BT<std::string> tmpOpt(pchOptions);
    tmpOpt.Value = genexInterpreter.Evaluate(tmpOpt.Value, COMPILE_OPTIONS);

    // After generator evaluation we need to use the AppendCompileOptions
    // method so we handle situations where backtrace entries have lists
    // and properly escape flags.
    std::string tmp;
    lg->AppendCompileOptions(tmp, tmpOpt.Value);
    BT<std::string> opt(tmp, tmpOpt.Backtrace);
    fd.Flags.emplace_back(this->ToJBT(opt));
  }

  // Add include directories from source file properties.
  {
    const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
    for (BT<std::string> tmpInclude : sf->GetIncludeDirectories()) {
      tmpInclude.Value =
        genexInterpreter.Evaluate(tmpInclude.Value, INCLUDE_DIRECTORIES);

      // After generator evaluation we need to use the AppendIncludeDirectories
      // method so we handle situations where backtrace entries have lists.
      std::vector<std::string> tmp;
      lg->AppendIncludeDirectories(tmp, tmpInclude.Value, *sf);
      for (std::string& i : tmp) {
        bool const isSystemInclude =
          this->GT->IsSystemIncludeDirectory(i, this->Config, fd.Language);
        BT<std::string> include(i, tmpInclude.Backtrace);
        fd.Includes.emplace_back(this->ToJBT(include), isSystemInclude);
      }
    }
  }

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  std::set<BT<std::string>> fileDefines;
  for (BT<std::string> tmpDef : sf->GetCompileDefinitions()) {
    tmpDef.Value =
      genexInterpreter.Evaluate(tmpDef.Value, COMPILE_DEFINITIONS);

    // After generator evaluation we need to use the AppendDefines method
    // so we handle situations where backtrace entries have lists.
    std::set<std::string> tmp;
    lg->AppendDefines(tmp, tmpDef.Value);
    for (const std::string& i : tmp) {
      BT<std::string> def(i, tmpDef.Backtrace);
      fileDefines.insert(def);
    }
  }

  std::set<std::string> configFileDefines;
  const std::string defPropName =
    "COMPILE_DEFINITIONS_" + cmSystemTools::UpperCase(this->Config);
  if (cmValue config_defs = sf->GetProperty(defPropName)) {
    lg->AppendDefines(
      configFileDefines,
      genexInterpreter.Evaluate(*config_defs, COMPILE_DEFINITIONS));
  }

  fd.Defines.reserve(fileDefines.size() + configFileDefines.size());

  for (BT<std::string> const& def : fileDefines) {
    fd.Defines.emplace_back(this->ToJBT(def));
  }

  for (std::string const& d : configFileDefines) {
    fd.Defines.emplace_back(d, JBTIndex());
  }

  return fd;
}